

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O0

void select_scan_parameters(j_compress_ptr cinfo)

{
  int *piVar1;
  long *in_RDI;
  jpeg_scan_info *scanptr;
  my_master_ptr master;
  int ci;
  int local_c;
  
  if (in_RDI[0x23] == 0) {
    if (4 < *(int *)((long)in_RDI + 0x5c)) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1b;
      *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x5c);
      *(undefined4 *)(*in_RDI + 0x30) = 4;
      (**(code **)*in_RDI)(in_RDI);
    }
    *(undefined4 *)(in_RDI + 0x2e) = *(undefined4 *)((long)in_RDI + 0x5c);
    for (local_c = 0; local_c < *(int *)((long)in_RDI + 0x5c); local_c = local_c + 1) {
      in_RDI[(long)local_c + 0x2f] = in_RDI[0xd] + (long)local_c * 0x60;
    }
  }
  else {
    piVar1 = (int *)(in_RDI[0x23] + (long)*(int *)(in_RDI[0x3e] + 0x2c) * 0x24);
    *(int *)(in_RDI + 0x2e) = *piVar1;
    for (local_c = 0; local_c < *piVar1; local_c = local_c + 1) {
      in_RDI[(long)local_c + 0x2f] = in_RDI[0xd] + (long)piVar1[(long)local_c + 1] * 0x60;
    }
    if ((int)in_RDI[0x2b] != 0) {
      *(int *)((long)in_RDI + 0x1cc) = piVar1[5];
      *(int *)(in_RDI + 0x3a) = piVar1[6];
      *(int *)((long)in_RDI + 0x1d4) = piVar1[7];
      *(int *)(in_RDI + 0x3b) = piVar1[8];
      return;
    }
  }
  *(undefined4 *)((long)in_RDI + 0x1cc) = 0;
  *(int *)(in_RDI + 0x3a) = *(int *)((long)in_RDI + 0x1dc) * *(int *)((long)in_RDI + 0x1dc) + -1;
  *(undefined4 *)((long)in_RDI + 0x1d4) = 0;
  *(undefined4 *)(in_RDI + 0x3b) = 0;
  return;
}

Assistant:

LOCAL(void)
select_scan_parameters (j_compress_ptr cinfo)
/* Set up the scan parameters for the current scan */
{
  int ci;

#ifdef C_MULTISCAN_FILES_SUPPORTED
  if (cinfo->scan_info != NULL) {
    /* Prepare for current scan --- the script is already validated */
    my_master_ptr master = (my_master_ptr) cinfo->master;
    const jpeg_scan_info * scanptr = cinfo->scan_info + master->scan_number;

    cinfo->comps_in_scan = scanptr->comps_in_scan;
    for (ci = 0; ci < scanptr->comps_in_scan; ci++) {
      cinfo->cur_comp_info[ci] =
	&cinfo->comp_info[scanptr->component_index[ci]];
    }
    if (cinfo->progressive_mode) {
      cinfo->Ss = scanptr->Ss;
      cinfo->Se = scanptr->Se;
      cinfo->Ah = scanptr->Ah;
      cinfo->Al = scanptr->Al;
      return;
    }
  }
  else
#endif
  {
    /* Prepare for single sequential-JPEG scan containing all components */
    if (cinfo->num_components > MAX_COMPS_IN_SCAN)
      ERREXIT2(cinfo, JERR_COMPONENT_COUNT, cinfo->num_components,
	       MAX_COMPS_IN_SCAN);
    cinfo->comps_in_scan = cinfo->num_components;
    for (ci = 0; ci < cinfo->num_components; ci++) {
      cinfo->cur_comp_info[ci] = &cinfo->comp_info[ci];
    }
  }
  cinfo->Ss = 0;
  cinfo->Se = cinfo->block_size * cinfo->block_size - 1;
  cinfo->Ah = 0;
  cinfo->Al = 0;
}